

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

string * __thiscall
enact::AstSerialise::visitForExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ForExpr *expr)

{
  Expr *pEVar1;
  BlockExpr *pBVar2;
  ostream *poVar3;
  stringstream s;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(Expr::For (",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(expr->name).lexeme._M_dataplus._M_p,
                      (expr->name).lexeme._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pEVar1 = (expr->object)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>
           ._M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&local_1d8,pEVar1,&this->field_0x8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::string::append((char *)&this->m_ident);
  pBVar2 = (expr->body)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar2->super_Expr)._vptr_Expr[2])(&local_1d8,pBVar2,&this->field_0x8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitForExpr(ForExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::For (" << expr.name.lexeme << " " << visitExpr(*expr.object) << ")\n";
        m_ident += "    ";

        s << visitExpr(*expr.body);

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }